

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::DummyBinding::ParamToArg(DummyBinding *this,ColumnRefExpression *colref)

{
  bool bVar1;
  undefined8 uVar2;
  string *psVar3;
  pointer pPVar4;
  BaseExpression *this_00;
  BaseExpression *in_RDX;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> in_RDI;
  column_t column_index;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *arg;
  string *in_stack_ffffffffffffff38;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *in_stack_ffffffffffffff40;
  column_t *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  allocator *paVar5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_01;
  string local_78 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  InternalException *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [40];
  BaseExpression *local_18;
  
  this_01._M_head_impl =
       (ParsedExpression *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  local_18 = in_RDX;
  ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)0xe732e6);
  bVar1 = Binding::TryGetBindingIndex
                    ((Binding *)this_01._M_head_impl,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58);
  if (bVar1) {
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
    ::operator[](in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)in_stack_ffffffffffffff40);
    (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[0xc])(this_01._M_head_impl);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_ffffffffffffff40);
    this_00 = (BaseExpression *)BaseExpression::GetAlias_abi_cxx11_(local_18);
    BaseExpression::SetAlias(this_00,in_stack_ffffffffffffff38);
    return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  paVar5 = &local_41;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_40,"Column %s not found in macro",paVar5);
  psVar3 = ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)0xe73351);
  ::std::__cxx11::string::string(local_78,(string *)psVar3);
  InternalException::InternalException<std::__cxx11::string>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

unique_ptr<ParsedExpression> DummyBinding::ParamToArg(ColumnRefExpression &colref) {
	column_t column_index;
	if (!TryGetBindingIndex(colref.GetColumnName(), column_index)) {
		throw InternalException("Column %s not found in macro", colref.GetColumnName());
	}
	auto arg = (*arguments)[column_index]->Copy();
	arg->SetAlias(colref.GetAlias());
	return arg;
}